

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  size_type __dnew;
  PropertiesReader pr;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_70 = (string *)&this->controlChannel;
  local_88 = &(this->controlChannel).field_2;
  (this->controlChannel)._M_dataplus._M_p = (pointer)local_88;
  (this->controlChannel)._M_string_length = 0;
  (this->controlChannel).field_2._M_local_buf[0] = '\0';
  local_78 = (string *)&this->localControlChannel;
  local_90 = &(this->localControlChannel).field_2;
  (this->localControlChannel)._M_dataplus._M_p = (pointer)local_90;
  (this->localControlChannel)._M_string_length = 0;
  (this->localControlChannel).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->controlResponseChannel;
  local_98 = &(this->controlResponseChannel).field_2;
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)local_98;
  (this->controlResponseChannel)._M_string_length = 0;
  (this->controlResponseChannel).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->recordingEventsChannel).field_2;
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)local_a0;
  (this->recordingEventsChannel)._M_string_length = 0;
  (this->recordingEventsChannel).field_2._M_local_buf[0] = '\0';
  util::PropertiesReader::PropertiesReader((PropertiesReader *)&local_68,(string *)filename,true);
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.message.timeout","");
  local_e8._M_dataplus._M_p = (pointer)0x12a05f200;
  lVar6 = util::PropertiesReader::get<long>
                    ((PropertiesReader *)&local_68,&local_108,(long *)&local_e8);
  this->messageTimeoutNs = lVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"aeron.archive.control.channel","");
  paVar3 = &local_c8.field_2;
  local_a8 = 0x21;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  local_c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_a8);
  local_c8.field_2._M_allocated_capacity = local_a8;
  builtin_strncpy(local_c8._M_dataplus._M_p,"aeron:udp?endpoint=localhost:8010",0x21);
  local_c8._M_string_length = local_a8;
  local_c8._M_dataplus._M_p[local_a8] = '\0';
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_108,(PropertiesReader *)&local_68,&local_e8,&local_c8);
  std::__cxx11::string::operator=(local_70,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.control.stream.id","");
  local_e8._M_dataplus._M_p._0_4_ = 10;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->controlStreamId = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"aeron.archive.local.control.channel","");
  local_c8.field_2._M_allocated_capacity = 0x70693a6e6f726561;
  local_c8.field_2._8_2_ = 99;
  local_c8._M_string_length = 9;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_108,(PropertiesReader *)&local_68,&local_e8,&local_c8);
  std::__cxx11::string::operator=(local_78,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.local.control.stream.id","");
  local_e8._M_dataplus._M_p._0_4_ = 0xb;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->localControlStreamId = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"aeron.archive.control.response.channel","");
  local_a8 = 0x21;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  local_c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_a8);
  local_c8.field_2._M_allocated_capacity = local_a8;
  builtin_strncpy(local_c8._M_dataplus._M_p,"aeron:udp?endpoint=localhost:8020",0x21);
  local_c8._M_string_length = local_a8;
  local_c8._M_dataplus._M_p[local_a8] = '\0';
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_108,(PropertiesReader *)&local_68,&local_e8,&local_c8);
  std::__cxx11::string::operator=(local_80,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.control.response.stream.id","");
  local_e8._M_dataplus._M_p._0_4_ = 0x14;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->controlResponseStreamId = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"aeron.archive.recording.events.channel","");
  local_a8 = 0x21;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  local_c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_a8);
  local_c8.field_2._M_allocated_capacity = local_a8;
  builtin_strncpy(local_c8._M_dataplus._M_p,"aeron:udp?endpoint=localhost:8030",0x21);
  local_c8._M_string_length = local_a8;
  local_c8._M_dataplus._M_p[local_a8] = '\0';
  util::PropertiesReader::get<std::__cxx11::string>
            (&local_108,(PropertiesReader *)&local_68,&local_e8,&local_c8);
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.recording.events.stream.id","");
  local_e8._M_dataplus._M_p._0_4_ = 0x1e;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->recordingEventsStreamId = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.control.term.buffer.sparse","");
  local_e8._M_dataplus._M_p._0_1_ = 1;
  bVar4 = util::PropertiesReader::get<bool>
                    ((PropertiesReader *)&local_68,&local_108,(bool *)&local_e8);
  this->controlTermBufferSparse = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.control.term.buffer.length","");
  local_e8._M_dataplus._M_p._0_4_ = 0x10000;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->controlTermBufferLength = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"aeron.archive.control.mtu.length","");
  local_e8._M_dataplus._M_p._0_4_ = 0x580;
  iVar5 = util::PropertiesReader::get<int>
                    ((PropertiesReader *)&local_68,&local_108,(int *)&local_e8);
  this->controlMtuLength = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

Configuration::Configuration(const std::string& filename) {
    util::PropertiesReader pr(filename, true);

    messageTimeoutNs = pr.get(MessageTimeout::key(), MessageTimeout::defaultValue());
    controlChannel = pr.get(ControlChannel::key(), ControlChannel::defaultValue());
    controlStreamId = pr.get(ControlStreamId::key(), ControlStreamId::defaultValue());
    localControlChannel = pr.get(LocalControlChannel::key(), LocalControlChannel::defaultValue());
    localControlStreamId = pr.get(LocalControlStreamId::key(), LocalControlStreamId::defaultValue());
    controlResponseChannel = pr.get(ControlResponseChannel::key(), ControlResponseChannel::defaultValue());
    controlResponseStreamId = pr.get(ControlResponseStreamId::key(), ControlResponseStreamId::defaultValue());
    recordingEventsChannel = pr.get(RecordingEventsChannel::key(), RecordingEventsChannel::defaultValue());
    recordingEventsStreamId = pr.get(RecordingEventsStreamId::key(), RecordingEventsStreamId::defaultValue());
    controlTermBufferSparse = pr.get(ControlTermBufferSparse::key(), ControlTermBufferSparse::defaultValue());
    controlTermBufferLength = pr.get(ControlTermBufferLength::key(), ControlTermBufferLength::defaultValue());
    controlMtuLength = pr.get(ControlMtuLength::key(), ControlMtuLength::defaultValue());
}